

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2adb13::BuildEngineImpl::cancelRemainingTasks(BuildEngineImpl *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  _Hash_node_base *p_Var3;
  pointer pRVar4;
  _Elt_pointer pTVar5;
  _Elt_pointer pTVar6;
  _Elt_pointer pTVar7;
  _Map_pointer ppTVar8;
  _Map_pointer ppTVar9;
  pointer pTVar10;
  _Elt_pointer ppTVar11;
  _Elt_pointer ppTVar12;
  _Elt_pointer ppTVar13;
  _Map_pointer pppTVar14;
  _Map_pointer pppTVar15;
  int iVar16;
  _Hash_node_base *p_Var17;
  ulong uVar18;
  _Map_pointer ppTVar19;
  _Map_pointer pppTVar20;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_48;
  pthread_mutex_t *local_38;
  
  if (this->numOutstandingUnfinishedTasks != 0) {
    do {
      local_48._M_owns = false;
      local_48._M_device = &this->finishedTaskInfosMutex;
      std::unique_lock<std::mutex>::lock(&local_48);
      local_48._M_owns = true;
      ppTVar1 = (this->finishedTaskInfos).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar2 = (this->finishedTaskInfos).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar1 == ppTVar2) {
        std::condition_variable::wait((unique_lock *)&this->finishedTaskInfosCondition);
      }
      else {
        uVar18 = (long)ppTVar2 - (long)ppTVar1 >> 3;
        if (this->numOutstandingUnfinishedTasks < uVar18) {
          __assert_fail("finishedTaskInfos.size() <= numOutstandingUnfinishedTasks",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                        ,0x53b,"void (anonymous namespace)::BuildEngineImpl::cancelRemainingTasks()"
                       );
        }
        this->numOutstandingUnfinishedTasks = this->numOutstandingUnfinishedTasks - (int)uVar18;
        (this->finishedTaskInfos).
        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
      }
      if (local_48._M_owns == true) {
        std::unique_lock<std::mutex>::unlock(&local_48);
      }
    } while (this->numOutstandingUnfinishedTasks != 0);
  }
  iVar16 = pthread_mutex_lock((pthread_mutex_t *)&this->taskInfosMutex);
  if (iVar16 == 0) {
    p_Var17 = (this->taskInfos)._M_h._M_before_begin._M_nxt;
    while( true ) {
      if (p_Var17 == (_Hash_node_base *)0x0) {
        for (p_Var17 = (this->ruleInfos)._M_h._M_before_begin._M_nxt;
            p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
          if (*(int *)&p_Var17[0x13]._M_nxt == 1) {
            *(undefined4 *)&p_Var17[0x13]._M_nxt = 0;
          }
        }
        pRVar4 = (this->ruleInfosToScan).
                 super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->ruleInfosToScan).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
            ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
          (this->ruleInfosToScan).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
        }
        pTVar5 = (this->inputRequests).
                 super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pTVar6 = (this->inputRequests).
                 super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first;
        pTVar7 = (this->inputRequests).
                 super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppTVar9 = (this->inputRequests).
                  super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppTVar8 = (this->inputRequests).
                  super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        local_38 = (pthread_mutex_t *)&this->taskInfosMutex;
        for (ppTVar19 = ppTVar8; ppTVar19 < ppTVar9; ppTVar19 = ppTVar19 + 1) {
          operator_delete(ppTVar19[1],0x200);
        }
        (this->inputRequests).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = pTVar5;
        (this->inputRequests).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first = pTVar6;
        (this->inputRequests).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last = pTVar7;
        (this->inputRequests).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = ppTVar8;
        pTVar10 = (this->finishedInputRequests).
                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->finishedInputRequests).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
            ._M_impl.super__Vector_impl_data._M_finish != pTVar10) {
          (this->finishedInputRequests).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish = pTVar10;
        }
        ppTVar11 = (this->readyTaskInfos).
                   super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
        ppTVar12 = (this->readyTaskInfos).
                   super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
        ppTVar13 = (this->readyTaskInfos).
                   super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
        pppTVar15 = (this->readyTaskInfos).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
        pppTVar14 = (this->readyTaskInfos).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
        for (pppTVar20 = pppTVar14; pppTVar20 < pppTVar15; pppTVar20 = pppTVar20 + 1) {
          operator_delete(pppTVar20[1],0x200);
        }
        (this->readyTaskInfos).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = ppTVar11;
        (this->readyTaskInfos).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first = ppTVar12;
        (this->readyTaskInfos).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last = ppTVar13;
        (this->readyTaskInfos).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = pppTVar14;
        ppTVar1 = (this->finishedTaskInfos).
                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->finishedTaskInfos).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppTVar1) {
          (this->finishedTaskInfos).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
        }
        std::
        _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(&(this->taskInfos)._M_h);
        pthread_mutex_unlock(local_38);
        return;
      }
      p_Var3 = p_Var17[9]._M_nxt;
      if (((ulong)p_Var3[0x11]._M_nxt & 0xfffffffe) != 4) break;
      if (p_Var17 + 2 != p_Var3[2]._M_nxt) {
        __assert_fail("taskInfo == ruleInfo->getPendingTaskInfo()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x553,"void (anonymous namespace)::BuildEngineImpl::cancelRemainingTasks()");
      }
      p_Var3[2]._M_nxt = (_Hash_node_base *)0x0;
      *(undefined4 *)&p_Var3[0x11]._M_nxt = 0;
      p_Var17 = p_Var17->_M_nxt;
    }
    __assert_fail("isInProgress()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x119,
                  "TaskInfo *(anonymous namespace)::BuildEngineImpl::RuleInfo::getPendingTaskInfo()"
                 );
  }
  std::__throw_system_error(iVar16);
}

Assistant:

void cancelRemainingTasks() {
    // We need to wait for any currently running tasks to be reported as
    // complete. Not doing this would mean we could get asynchronous calls
    // attempting to modify the task state concurrently with the cancellation
    // process, which isn't something we want to need to synchronize on.
    //
    // We don't process the requests at all, we simply drain them. In practice,
    // we expect clients to implement cancellation in conjection with causing
    // long-running tasks to also cancel and fail, so preserving those results
    // is not valuable.
    while (numOutstandingUnfinishedTasks != 0) {
        std::unique_lock<std::mutex> lock(finishedTaskInfosMutex);
        if (finishedTaskInfos.empty()) {
          finishedTaskInfosCondition.wait(lock);
        } else {
          assert(finishedTaskInfos.size() <= numOutstandingUnfinishedTasks);
          numOutstandingUnfinishedTasks -= finishedTaskInfos.size();
          finishedTaskInfos.clear();
        }
    }

    std::lock_guard<std::mutex> guard(taskInfosMutex);

    for (auto& it: taskInfos) {
      // Cancel the task, marking it incomplete.
      //
      // This will force it to rerun in a later build, but since it was already
      // running in this build that was almost certainly going to be
      // required. Technically, there are rare situations where it wouldn't have
      // to rerun (e.g., if resultIsValid becomes true after being false in this
      // run), and if we were willing to restore the tasks state--either by
      // keeping the old one or by restoring from the database--we could ensure
      // that doesn't happen.
      //
      // NOTE: Actually, we currently don't sync this write to the database, so
      // in some cases we do actually preserve this information (if the client
      // ends up cancelling, then reloading froom the database).
      TaskInfo* taskInfo = &it.second;
      RuleInfo* ruleInfo = taskInfo->forRuleInfo;
      assert(taskInfo == ruleInfo->getPendingTaskInfo());
      ruleInfo->setPendingTaskInfo(nullptr);
      ruleInfo->setCancelled();
    }

    // FIXME: This is currently an O(n) operation that could be relatively
    // expensive on larger projects.  We should be able to do something more
    // targeted. rdar://problem/39386591
    for (auto& it: ruleInfos) {
      // Cancel outstanding activity on rules
      if (it.second.isScanning()) {
        it.second.setCancelled();
      }
    }

    // Delete all of the tasks.
    ruleInfosToScan.clear();
    inputRequests.clear();
    finishedInputRequests.clear();
    readyTaskInfos.clear();
    finishedTaskInfos.clear();
    taskInfos.clear();
  }